

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

void __thiscall RtApiAlsa::probeDevices(RtApiAlsa *this)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *__args;
  size_t __n;
  pointer pcVar1;
  void *pvVar2;
  pointer ppVar3;
  long lVar4;
  pointer __pos;
  undefined8 *puVar5;
  undefined1 *puVar6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [8];
  uint uVar9;
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  *this_00;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  string *this_01;
  undefined8 uVar14;
  undefined8 uVar15;
  ostream *poVar16;
  char *pcVar17;
  iterator __position;
  iterator __position_00;
  ulong uVar18;
  pointer ppVar19;
  undefined8 *puVar20;
  long *plVar21;
  char *__s;
  pointer ppVar22;
  void *__s_00;
  bool bVar23;
  bool bVar24;
  undefined8 uStack_200;
  char local_1f8 [8];
  char name [128];
  string local_170;
  undefined1 local_150 [8];
  string prettyName;
  string defaultDeviceName;
  string id;
  undefined1 local_e8 [8];
  DeviceInfo info;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  deviceID_prettyName;
  long local_50;
  snd_ctl_t *handle;
  ostream *poStack_40;
  int device;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  int card;
  
  local_50 = 0;
  uStack_200 = 0x10b3f3;
  lVar12 = snd_ctl_card_info_sizeof();
  lVar12 = -(lVar12 + 0xfU & 0xfffffffffffffff0);
  __s = local_1f8 + lVar12;
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x10b409;
  sVar13 = snd_ctl_card_info_sizeof();
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x10b416;
  memset(__s,0,sVar13);
  *(undefined8 *)((long)&uStack_200 + lVar12) = 0x10b41b;
  lVar12 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar12 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x10b431;
  sVar13 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x10b43e;
  memset(__s_00,0,sVar13);
  info.nativeFormats = 0;
  prettyName.field_2._8_8_ = &defaultDeviceName._M_string_length;
  defaultDeviceName._M_dataplus._M_p = (pointer)0x0;
  defaultDeviceName._M_string_length._0_1_ = 0;
  *(undefined8 *)((long)__s_00 + -8) = 0x10b46c;
  iVar11 = snd_ctl_open(&local_50,"default",0);
  if (iVar11 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b48a;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[8],_const_char_(&)[20],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [8])"default",(char (*) [20])"Default ALSA Device");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b49a;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar14 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b4af;
      operator_delete((void *)uVar14);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b4c4;
      operator_delete(puVar6);
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4d8;
    std::__cxx11::string::_M_assign((string *)(prettyName.field_2._M_local_buf + 8));
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4e1;
    snd_ctl_close(lVar12);
    *(undefined8 *)((long)__s_00 + -8) = 0x10b4e6;
    snd_config_update_free_global();
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x10b4f8;
  iVar11 = snd_ctl_open(&local_50,"pulse",0);
  if (iVar11 == 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b516;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[6],_const_char_(&)[24],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8,(char (*) [6])"pulse",(char (*) [24])"PulseAudio Sound Server");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b526;
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&info.nativeFormats,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
    uVar14 = info.name.field_2._M_allocated_capacity;
    if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b53b;
      operator_delete((void *)uVar14);
    }
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b550;
      operator_delete(puVar6);
    }
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b559;
    snd_ctl_close(lVar12);
    *(undefined8 *)((long)__s_00 + -8) = 0x10b55e;
    snd_config_update_free_global();
  }
  __range2._4_4_ = -1;
  *(undefined8 *)((long)__s_00 + -8) = 0x10b56d;
  snd_card_next();
  poStack_40 = (ostream *)&(this->super_RtApi).errorStream_;
  this_01 = &(this->super_RtApi).errorText_;
  while (-1 < __range2._4_4_) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b5ae;
    sprintf(local_1f8,"hw:%d");
    *(undefined8 *)((long)__s_00 + -8) = 0x10b5bc;
    iVar11 = snd_ctl_open(&local_50,local_1f8,0);
    poVar16 = poStack_40;
    lVar12 = local_50;
    if (iVar11 < 0) {
      local_50 = 0;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8e8;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDevices: control open, card = ",0x2e);
      iVar10 = __range2._4_4_;
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8f4;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b90b;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b913;
      pcVar17 = (char *)snd_strerror(iVar11);
      if (pcVar17 == (char *)0x0) {
        uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba21;
        std::ios::clear((int)poVar16 + (int)uVar14);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b927;
        sVar13 = strlen(pcVar17);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b935;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x10ba35;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x10ba48;
      std::__cxx11::stringbuf::str();
    }
    else {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b5d3;
      iVar11 = snd_ctl_card_info(lVar12,__s);
      poVar16 = poStack_40;
      if (iVar11 < 0) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b94f;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDevices: control info, card = ",0x2e);
        iVar10 = __range2._4_4_;
        poVar16 = poStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b95b;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b972;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b97a;
        pcVar17 = (char *)snd_strerror(iVar11);
        if (pcVar17 == (char *)0x0) {
          uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x10ba66;
          std::ios::clear((int)poVar16 + (int)uVar14);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x10b98e;
          sVar13 = strlen(pcVar17);
          *(undefined8 *)((long)__s_00 + -8) = 0x10b99c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba7a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x10ba8d;
        std::__cxx11::stringbuf::str();
      }
      else {
        handle._4_4_ = 0xffffffff;
LAB_0010b5e5:
        lVar12 = local_50;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b5f2;
        iVar11 = snd_ctl_pcm_next_device(lVar12,(long)&handle + 4);
        poVar16 = poStack_40;
        if (-1 < iVar11) {
          if (-1 < (int)handle._4_4_) {
            *(undefined8 *)((long)__s_00 + -8) = 0x10b610;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x10b61a;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 0x10b624;
            snd_pcm_info_set_stream(__s_00,0);
            lVar12 = local_50;
            *(undefined8 *)((long)__s_00 + -8) = 0x10b630;
            iVar11 = snd_ctl_pcm_info(lVar12,__s_00);
            if (iVar11 < 0) goto LAB_0010b7a5;
            goto LAB_0010b638;
          }
          goto LAB_0010bb01;
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9b6;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"RtApiAlsa::probeDevices: control next device, card = ",0x35);
        iVar10 = __range2._4_4_;
        poVar16 = poStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9c2;
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9d9;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b9e1;
        pcVar17 = (char *)snd_strerror(iVar11);
        if (pcVar17 == (char *)0x0) {
          uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
          *(undefined8 *)((long)__s_00 + -8) = 0x10baa8;
          std::ios::clear((int)poVar16 + (int)uVar14);
        }
        else {
          *(undefined8 *)((long)__s_00 + -8) = 0x10b9f5;
          sVar13 = strlen(pcVar17);
          *(undefined8 *)((long)__s_00 + -8) = 0x10ba03;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
        }
        *(undefined8 *)((long)__s_00 + -8) = 0x10babc;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        *(undefined8 *)((long)__s_00 + -8) = 0x10bacf;
        std::__cxx11::stringbuf::str();
      }
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10badb;
    std::__cxx11::string::operator=((string *)this_01,(string *)local_e8);
    puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    if ((string *)puVar6 != &info.name) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10baf3;
      operator_delete(puVar6);
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10bb01;
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
LAB_0010bb01:
    if (local_50 != 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10bb0f;
      snd_ctl_close();
      *(undefined8 *)((long)__s_00 + -8) = 0x10bb14;
      snd_config_update_free_global();
    }
    *(undefined8 *)((long)__s_00 + -8) = 0x10bb1d;
    snd_card_next((long)&__range2 + 4);
  }
  if (info.nativeFormats != 0) {
    poStack_40 = (ostream *)&this->deviceIdPairs_;
    __position._M_current =
         (this->deviceIdPairs_).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_0010bb46:
    do {
      if (__position._M_current ==
          (this->deviceIdPairs_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010bbce;
      if (info.nativeFormats != 0) {
        sVar13 = ((__position._M_current)->first)._M_string_length;
        puVar5 = (undefined8 *)info.nativeFormats;
        do {
          puVar20 = puVar5 + 8;
          __n = puVar5[1];
          if (__n == sVar13) {
            if (__n == 0) {
              bVar23 = true;
            }
            else {
              pcVar1 = ((__position._M_current)->first)._M_dataplus._M_p;
              pvVar2 = (void *)*puVar5;
              *(undefined8 *)((long)__s_00 + -8) = 0x10bb82;
              iVar11 = bcmp(pvVar2,pcVar1,__n);
              bVar23 = iVar11 == 0;
            }
          }
          else {
            bVar23 = false;
          }
          bVar24 = false;
          if (bVar23) {
            bVar24 = true;
            break;
          }
          puVar5 = puVar20;
        } while (puVar20 != (undefined8 *)0x0);
        if (bVar24) {
          __position._M_current = __position._M_current + 1;
          goto LAB_0010bb46;
        }
      }
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x10bbc2;
      __position = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::_M_erase((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)poVar16,__position);
    } while( true );
  }
  __pos = (this->super_RtApi).deviceList_.
          super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
          super__Vector_impl_data._M_start;
  *(undefined8 *)((long)__s_00 + -8) = 0x10be85;
  std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase_at_end
            (&(this->super_RtApi).deviceList_,__pos);
  *(undefined8 *)((long)__s_00 + -8) = 0x10be94;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::clear(&this->deviceIdPairs_);
  goto LAB_0010be94;
LAB_0010b7a5:
  if (iVar11 == -2) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10b7bb;
    snd_pcm_info_set_stream(__s_00,1);
    lVar12 = local_50;
    *(undefined8 *)((long)__s_00 + -8) = 0x10b7c7;
    iVar11 = snd_ctl_pcm_info(lVar12,__s_00);
    poVar16 = poStack_40;
    if (iVar11 < 0) {
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7e6;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"RtApiAlsa::probeDevices: control pcm info, card = ",0x32);
      iVar10 = __range2._4_4_;
      poVar16 = poStack_40;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b7f2;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar10);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b809;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", device = ",0xb);
      uVar9 = handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b814;
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar9);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b82b;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b832;
      pcVar17 = (char *)snd_strerror(iVar11);
      if (pcVar17 == (char *)0x0) {
        uVar14 = *(undefined8 *)(*(long *)poVar16 + -0x18);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b86d;
        std::ios::clear((int)poVar16 + (int)uVar14);
      }
      else {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b842;
        sVar13 = strlen(pcVar17);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b850;
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar17,sVar13);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x10b881;
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b894;
      std::__cxx11::stringbuf::str();
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8a0;
      std::__cxx11::string::operator=((string *)this_01,(string *)local_e8);
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b8b8;
        operator_delete(puVar6);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x10b8c6;
      RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    }
    else {
LAB_0010b638:
      *(undefined8 *)((long)__s_00 + -8) = 0x10b640;
      uVar14 = snd_ctl_card_info_get_id(__s);
      uVar18 = (ulong)handle._4_4_;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b657;
      sprintf(local_1f8,"hw:%s,%d",uVar14,uVar18);
      defaultDeviceName.field_2._8_8_ = &id._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b66d;
      sVar13 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b687;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&defaultDeviceName.field_2 + 8),local_1f8,local_1f8 + sVar13);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b68f;
      uVar14 = snd_ctl_card_info_get_name(__s);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b69a;
      uVar15 = snd_pcm_info_get_id(__s_00);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6b1;
      sprintf(local_1f8,"%s (%s)",uVar14,uVar15);
      local_150 = (undefined1  [8])&prettyName._M_string_length;
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6c7;
      sVar13 = strlen(local_1f8);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6e4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,local_1f8,local_1f8 + sVar13);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b6fd;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&defaultDeviceName.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
      *(undefined8 *)((long)__s_00 + -8) = 0x10b709;
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&info.nativeFormats,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8);
      uVar14 = info.name.field_2._M_allocated_capacity;
      if ((uint *)info.name.field_2._M_allocated_capacity != &info.outputChannels) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b721;
        operator_delete((void *)uVar14);
      }
      puVar6 = (undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      if ((string *)puVar6 != &info.name) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b739;
        operator_delete(puVar6);
      }
      if ((handle._4_4_ == 0 && __range2._4_4_ == 0) &&
         (defaultDeviceName._M_dataplus._M_p == (pointer)0x0)) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b755;
        strlen(local_1f8);
        *(undefined8 *)((long)__s_00 + -8) = 0x10b76c;
        std::__cxx11::string::_M_replace
                  ((ulong)((long)&prettyName.field_2 + 8),0,(char *)0x0,(ulong)local_1f8);
      }
      auVar8 = local_150;
      if (local_150 != (undefined1  [8])&prettyName._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b784;
        operator_delete((void *)auVar8);
      }
      uVar14 = defaultDeviceName.field_2._8_8_;
      if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10b7a0;
        operator_delete((void *)uVar14);
      }
    }
  }
  goto LAB_0010b5e5;
LAB_0010bbce:
  if (info.nativeFormats != 0) {
    plVar21 = (long *)info.nativeFormats;
    do {
      ppVar19 = (this->deviceIdPairs_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 == ppVar3) {
LAB_0010bc6e:
        local_e8._0_4_ = 0;
        info._0_8_ = &info.name._M_string_length;
        info.name._M_dataplus._M_p = (pointer)0x0;
        info.name._M_string_length._0_1_ = 0;
        info.outputChannels = 0;
        info.inputChannels._0_1_ = 0;
        info.inputChannels._1_1_ = 0;
        info.name.field_2._8_4_ = 0;
        info.name.field_2._12_2_ = 0;
        info.name.field_2._14_2_ = 0;
        info.currentSampleRate = 0;
        info.preferredSampleRate = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        info.duplexChannels = 0;
        info.isDefaultOutput = false;
        info.isDefaultInput = false;
        info._54_2_ = 0;
        info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined8 *)((long)__s_00 + -8) = 0x10bcbd;
        std::__cxx11::string::_M_assign((string *)&info);
        __args = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)((long)&defaultDeviceName.field_2 + 8);
        lVar12 = *plVar21;
        lVar4 = plVar21[1];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        *(undefined8 *)((long)__s_00 + -8) = 0x10bce5;
        std::__cxx11::string::_M_construct<char*>((string *)&local_170,lVar12,lVar4 + lVar12);
        *(undefined8 *)((long)__s_00 + -8) = 0x10bcf7;
        bVar23 = probeDeviceInfo(this,(DeviceInfo *)local_e8,&local_170);
        _Var7._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd0b;
          operator_delete(_Var7._M_p);
        }
        _Var7._M_p = info.name._M_dataplus._M_p;
        uVar15 = info._0_8_;
        uVar14 = prettyName.field_2._8_8_;
        if (bVar23) {
          local_e8._0_4_ = (this->super_RtApi).currentDeviceId_;
          (this->super_RtApi).currentDeviceId_ = local_e8._0_4_ + 1;
          if (info.name._M_dataplus._M_p == defaultDeviceName._M_dataplus._M_p) {
            if (info.name._M_dataplus._M_p != (pointer)0x0) {
              *(undefined8 *)((long)__s_00 + -8) = 0x10bd57;
              iVar11 = bcmp((void *)uVar15,(void *)uVar14,(size_t)_Var7._M_p);
              if (iVar11 != 0) goto LAB_0010bd7b;
            }
            if (info.name.field_2._8_4_ != 0) {
              info.inputChannels._0_1_ = 1;
            }
            if (CONCAT22(info.name.field_2._14_2_,info.name.field_2._12_2_) != 0) {
              info.inputChannels._1_1_ = 1;
            }
          }
LAB_0010bd7b:
          *(undefined8 *)((long)__s_00 + -8) = 0x10bd8b;
          std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
                    (&(this->super_RtApi).deviceList_,(value_type *)local_e8);
          defaultDeviceName.field_2._8_8_ = &id._M_string_length;
          lVar12 = *plVar21;
          lVar4 = plVar21[1];
          *(undefined8 *)((long)__s_00 + -8) = 0x10bdac;
          std::__cxx11::string::_M_construct<char*>((string *)__args,lVar12,lVar4 + lVar12);
          this_00 = (vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                     *)poStack_40;
          id.field_2._8_4_ = local_e8._0_4_;
          *(undefined8 *)((long)__s_00 + -8) = 0x10bdc4;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>>(this_00,__args);
          uVar14 = defaultDeviceName.field_2._8_8_;
          if ((size_type *)defaultDeviceName.field_2._8_8_ != &id._M_string_length) {
            *(undefined8 *)((long)__s_00 + -8) = 0x10bddc;
            operator_delete((void *)uVar14);
          }
        }
        uVar14 = info._48_8_;
        if (info._48_8_ != 0) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10bded;
          operator_delete((void *)uVar14);
        }
        uVar14 = info._0_8_;
        if ((size_type *)info._0_8_ != &info.name._M_string_length) {
          *(undefined8 *)((long)__s_00 + -8) = 0x10be05;
          operator_delete((void *)uVar14);
        }
      }
      else {
        sVar13 = plVar21[1];
        bVar23 = false;
        do {
          ppVar22 = ppVar19 + 1;
          bVar24 = sVar13 == (ppVar19->first)._M_string_length;
          if (bVar24 && sVar13 != 0) {
            pcVar1 = (ppVar19->first)._M_dataplus._M_p;
            pvVar2 = (void *)*plVar21;
            *(undefined8 *)((long)__s_00 + -8) = 0x10bc37;
            iVar11 = bcmp(pvVar2,pcVar1,sVar13);
            bVar24 = iVar11 == 0;
          }
          if (bVar24) {
            bVar23 = true;
            break;
          }
          ppVar19 = ppVar22;
        } while (ppVar22 != ppVar3);
        if (!bVar23) goto LAB_0010bc6e;
      }
      plVar21 = plVar21 + 8;
    } while (plVar21 != (long *)0x0);
  }
  __position_00._M_current =
       (this->super_RtApi).deviceList_.
       super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position_00._M_current !=
      (this->super_RtApi).deviceList_.
      super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ppVar19 = (this->deviceIdPairs_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->deviceIdPairs_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar19 != ppVar3) {
        do {
          if ((__position_00._M_current)->ID == ppVar19->second) break;
          ppVar19 = ppVar19 + 1;
        } while (ppVar19 != ppVar3);
      }
      if (ppVar19 == ppVar3) {
        *(undefined8 *)((long)__s_00 + -8) = 0x10be63;
        __position_00 =
             std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::_M_erase
                       (&(this->super_RtApi).deviceList_,__position_00);
      }
      else {
        __position_00._M_current = __position_00._M_current + 1;
      }
    } while (__position_00._M_current !=
             (this->super_RtApi).deviceList_.
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
LAB_0010be94:
  uVar14 = prettyName.field_2._8_8_;
  if ((size_type *)prettyName.field_2._8_8_ != &defaultDeviceName._M_string_length) {
    *(undefined8 *)((long)__s_00 + -8) = 0x10beac;
    operator_delete((void *)uVar14);
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x10beb5;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&info.nativeFormats);
  return;
}

Assistant:

void RtApiAlsa :: probeDevices( void )
{
  // See list of required functionality in RtApi::probeDevices().
  
  int result, device, card;
  char name[128];
  snd_ctl_t *handle = 0;
  snd_ctl_card_info_t *ctlinfo;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&ctlinfo);
  snd_pcm_info_alloca(&pcminfo);
  // First element isthe device hw ID, second is the device "pretty name"
  std::vector<std::pair<std::string, std::string>> deviceID_prettyName;
  snd_pcm_stream_t stream;
  std::string defaultDeviceName;

  // Add the default interface if available.
  result = snd_ctl_open( &handle, "default", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"default", "Default ALSA Device"});
    defaultDeviceName = deviceID_prettyName[0].second;
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }

  // Add the Pulse interface if available.
  result = snd_ctl_open( &handle, "pulse", 0 );
  if (result == 0) {
    deviceID_prettyName.push_back({"pulse",  "PulseAudio Sound Server"});
    snd_ctl_close( handle );
    snd_config_update_free_global();
  }
  
  // Count cards and devices and get ascii identifiers.
  card = -1;
  snd_card_next( &card );
  while ( card >= 0 ) {
    sprintf( name, "hw:%d", card );
    result = snd_ctl_open( &handle, name, 0 );
    if ( result < 0 ) {
      handle = 0;
      errorStream_ << "RtApiAlsa::probeDevices: control open, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    result = snd_ctl_card_info( handle, ctlinfo );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::probeDevices: control info, card = " << card << ", " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      error( RTAUDIO_WARNING );
      goto nextcard;
    }
    device = -1;
    while( 1 ) {
      result = snd_ctl_pcm_next_device( handle, &device );
      if ( result < 0 ) {
        errorStream_ << "RtApiAlsa::probeDevices: control next device, card = " << card << ", " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
        error( RTAUDIO_WARNING );
        break;
      }
      if ( device < 0 )
        break;

      snd_pcm_info_set_device( pcminfo, device );
      snd_pcm_info_set_subdevice( pcminfo, 0 );
      stream = SND_PCM_STREAM_PLAYBACK;
      snd_pcm_info_set_stream( pcminfo, stream );
      result = snd_ctl_pcm_info( handle, pcminfo );
      if ( result < 0 ) {
        if ( result == -ENOENT ) { // try as input stream
          stream = SND_PCM_STREAM_CAPTURE;
          snd_pcm_info_set_stream( pcminfo, stream );
          result = snd_ctl_pcm_info( handle, pcminfo );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::probeDevices: control pcm info, card = " << card << ", device = " << device << ", " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
            error( RTAUDIO_WARNING );
            continue;
          }
        }
        else continue;
      }
      sprintf( name, "hw:%s,%d", snd_ctl_card_info_get_id(ctlinfo), device );
      std::string id(name);
      sprintf( name, "%s (%s)", snd_ctl_card_info_get_name(ctlinfo), snd_pcm_info_get_id(pcminfo) );
      std::string prettyName(name);
      deviceID_prettyName.push_back( {id, prettyName} );
      if ( card == 0 && device == 0 && defaultDeviceName.empty() )
        defaultDeviceName = name;
    }
  nextcard:
    if ( handle ) {
      snd_ctl_close( handle );
      snd_config_update_free_global();
    }
    snd_card_next( &card );
  }

  if ( deviceID_prettyName.size() == 0 ) {
    deviceList_.clear();
    deviceIdPairs_.clear();
    return;
  }

  // Clean removed devices
  for ( auto it = deviceIdPairs_.begin(); it != deviceIdPairs_.end(); ) {
    bool found = false;
    for ( auto& d: deviceID_prettyName ) {
      if ( d.first == (*it).first ) {
        found = true;
        break;
      }
    }

    if ( found )
      ++it;
    else
      it = deviceIdPairs_.erase(it);
  }

  // Fill or update the deviceList_ and also save a corresponding list of Ids.
  for ( auto& d : deviceID_prettyName ) {
    bool found = false;
    for ( auto& dID : deviceIdPairs_ ) {
      if ( d.first == dID.first ) {
        found = true;
        break; // We already have this device.
      }
    }

    if ( found )
      continue;

    // new device
    RtAudio::DeviceInfo info;
    info.name = d.second;
    if ( probeDeviceInfo( info, d.first ) == false ) continue; // ignore if probe fails
    info.ID = currentDeviceId_++;  // arbitrary internal device ID
    if ( info.name == defaultDeviceName ) {
      if ( info.outputChannels > 0 ) info.isDefaultOutput = true;
      if ( info.inputChannels > 0 ) info.isDefaultInput = true;
    }
    deviceList_.push_back( info );
    deviceIdPairs_.push_back({d.first, info.ID});
    // I don't see that ALSA provides property listeners to know if
    // devices are removed or added.
  }

  // Remove any devices left in the list that are no longer available.
  for ( std::vector<RtAudio::DeviceInfo>::iterator it=deviceList_.begin(); it!=deviceList_.end(); )
  {
    auto itID = deviceIdPairs_.begin();
    while ( itID != deviceIdPairs_.end() ) {
      if ( (*it).ID == (*itID).second ) {
        break;
      }
      ++itID;
    }

    if ( itID == deviceIdPairs_.end() ) {
      // not found so remove it from our list
      it = deviceList_.erase( it );
    }
    else
      ++it;
  }
}